

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  RepeatedField<int> *pRVar1;
  bool bVar2;
  CppType CVar3;
  pointer ppVar4;
  LogMessage *pLVar5;
  string *local_d0;
  MessageLite *ret;
  LogMessage local_c0;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  _Self local_38;
  _Self local_30;
  iterator iter;
  MessageLite *prototype_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  iter._M_node = (_Base_ptr)prototype;
  prototype_local._4_4_ = number;
  pEStack_18 = this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,(key_type *)((long)&prototype_local + 4));
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  bVar2 = std::operator==(&local_30,&local_38);
  if (bVar2) {
    this_local = (ExtensionSet *)0x0;
  }
  else {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_30);
    local_71 = 0;
    if (((ppVar4->second).is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x206);
      local_71 = 1;
      pLVar5 = LogMessage::operator<<
                         (&local_70,
                          "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(local_85,pLVar5);
    }
    if ((local_71 & 1) != 0) {
      LogMessage::~LogMessage(&local_70);
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_30);
    CVar3 = anon_unknown_0::cpp_type((ppVar4->second).type);
    ret._7_1_ = 0;
    if (CVar3 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x206);
      ret._7_1_ = 1;
      pLVar5 = LogMessage::operator<<
                         (&local_c0,
                          "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)((long)&ret + 6),pLVar5);
    }
    if ((ret._7_1_ & 1) != 0) {
      LogMessage::~LogMessage(&local_c0);
    }
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->(&local_30);
    if (((byte)(ppVar4->second).field_0xa >> 4 & 1) == 0) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_30);
      local_d0 = (ppVar4->second).field_0.string_value;
    }
    else {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_30);
      pRVar1 = (ppVar4->second).field_0.repeated_int32_value;
      local_d0 = (string *)(**(code **)(pRVar1->elements_ + 0xc))(pRVar1,iter._M_node);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
               ::operator->(&local_30);
      pRVar1 = (ppVar4->second).field_0.repeated_int32_value;
      if (pRVar1 != (RepeatedField<int> *)0x0) {
        (**(code **)(pRVar1->elements_ + 2))();
      }
    }
    std::
    map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::erase(&this->extensions_,(key_type *)((long)&prototype_local + 4));
    this_local = (ExtensionSet *)local_d0;
  }
  return (MessageLite *)this_local;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  map<int, Extension>::iterator iter = extensions_.find(number);
  if (iter == extensions_.end()) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (iter->second.is_lazy) {
      ret = iter->second.lazymessage_value->ReleaseMessage(prototype);
      delete iter->second.lazymessage_value;
    } else {
      ret = iter->second.message_value;
    }
    extensions_.erase(number);
    return ret;
  }
}